

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void ps_parser_skip_PS_token(PS_Parser parser)

{
  FT_Byte *limit_00;
  FT_Byte *pFVar1;
  FT_Error local_24;
  FT_Error error;
  FT_Byte *limit;
  FT_Byte *cur;
  PS_Parser parser_local;
  
  limit = parser->cursor;
  limit_00 = parser->limit;
  local_24 = 0;
  cur = (FT_Byte *)parser;
  skip_spaces(&limit,limit_00);
  if (limit < limit_00) {
    if ((*limit == '[') || (*limit == ']')) {
      limit = limit + 1;
    }
    else if (*limit == '{') {
      local_24 = skip_procedure(&limit,limit_00);
    }
    else if (*limit == '(') {
      local_24 = skip_literal_string(&limit,limit_00);
    }
    else if (*limit == '<') {
      if ((limit + 1 < limit_00) && (limit[1] == '<')) {
        limit = limit + 2;
      }
      else {
        local_24 = skip_string(&limit,limit_00);
      }
    }
    else if (*limit == '>') {
      pFVar1 = limit + 1;
      if ((pFVar1 < limit_00) && (*pFVar1 == '>')) {
        limit = limit + 2;
      }
      else {
        local_24 = 3;
        limit = pFVar1;
      }
    }
    else {
      if (*limit == '/') {
        limit = limit + 1;
      }
      for (; (((((limit < limit_00 && (*limit != ' ')) && (*limit != '\r')) &&
               ((*limit != '\n' && (*limit != '\t')))) &&
              (((*limit != '\f' && ((*limit != '\0' && (*limit != '/')))) && (*limit != '(')))) &&
             ((((*limit != ')' && (*limit != '<')) && (*limit != '>')) &&
              (((*limit != '[' && (*limit != ']')) &&
               ((*limit != '{' && ((*limit != '}' && (*limit != '%')))))))))); limit = limit + 1) {
      }
    }
  }
  if ((limit < limit_00) && (limit == *(FT_Byte **)cur)) {
    local_24 = 3;
  }
  if (limit_00 < limit) {
    limit = limit_00;
  }
  *(FT_Error *)(cur + 0x18) = local_24;
  *(FT_Byte **)cur = limit;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_skip_PS_token( PS_Parser  parser )
  {
    /* Note: PostScript allows any non-delimiting, non-whitespace        */
    /*       character in a name (PS Ref Manual, 3rd ed, p31).           */
    /*       PostScript delimiters are (, ), <, >, [, ], {, }, /, and %. */

    FT_Byte*  cur   = parser->cursor;
    FT_Byte*  limit = parser->limit;
    FT_Error  error = FT_Err_Ok;


    skip_spaces( &cur, limit );             /* this also skips comments */
    if ( cur >= limit )
      goto Exit;

    /* self-delimiting, single-character tokens */
    if ( *cur == '[' || *cur == ']' )
    {
      cur++;
      goto Exit;
    }

    /* skip balanced expressions (procedures and strings) */

    if ( *cur == '{' )                              /* {...} */
    {
      error = skip_procedure( &cur, limit );
      goto Exit;
    }

    if ( *cur == '(' )                              /* (...) */
    {
      error = skip_literal_string( &cur, limit );
      goto Exit;
    }

    if ( *cur == '<' )                              /* <...> */
    {
      if ( cur + 1 < limit && *( cur + 1 ) == '<' ) /* << */
      {
        cur++;
        cur++;
      }
      else
        error = skip_string( &cur, limit );

      goto Exit;
    }

    if ( *cur == '>' )
    {
      cur++;
      if ( cur >= limit || *cur != '>' )             /* >> */
      {
        FT_ERROR(( "ps_parser_skip_PS_token:"
                   " unexpected closing delimiter `>'\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
      cur++;
      goto Exit;
    }

    if ( *cur == '/' )
      cur++;

    /* anything else */
    while ( cur < limit )
    {
      /* *cur might be invalid (e.g., ')' or '}'), but this   */
      /* is handled by the test `cur == parser->cursor' below */
      if ( IS_PS_DELIM( *cur ) )
        break;

      cur++;
    }

  Exit:
    if ( cur < limit && cur == parser->cursor )
    {
      FT_ERROR(( "ps_parser_skip_PS_token:"
                 " current token is `%c' which is self-delimiting\n",
                 *cur ));
      FT_ERROR(( "                        "
                 " but invalid at this point\n" ));

      error = FT_THROW( Invalid_File_Format );
    }

    if ( cur > limit )
      cur = limit;

    parser->error  = error;
    parser->cursor = cur;
  }